

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

double HistoQueuePush(HistoQueue *histo_queue,VP8LHistogram **histograms,int idx1,int idx2,
                     double threshold)

{
  int iVar1;
  HistogramPair *pHVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  HistogramPair tmp;
  HistogramPair pair;
  double local_18;
  
  dVar9 = 0.0;
  if (histo_queue->size != histo_queue->max_size) {
    iVar6 = idx2;
    if (idx2 < idx1) {
      iVar6 = idx1;
    }
    if (idx1 < idx2) {
      idx2 = idx1;
    }
    dVar8 = histograms[idx2]->bit_cost_ + histograms[iVar6]->bit_cost_;
    local_18 = 0.0;
    GetCombinedHistogramEntropy(histograms[idx2],histograms[iVar6],dVar8 + threshold,&local_18);
    dVar8 = local_18 - dVar8;
    dVar9 = 0.0;
    if (dVar8 < threshold) {
      pHVar2 = histo_queue->queue;
      iVar1 = histo_queue->size;
      histo_queue->size = iVar1 + 1;
      pHVar2[iVar1].cost_combo = local_18;
      pHVar2 = pHVar2 + iVar1;
      pHVar2->idx1 = idx2;
      pHVar2->idx2 = iVar6;
      pHVar2->cost_diff = dVar8;
      pHVar2 = histo_queue->queue;
      lVar7 = (long)histo_queue->size;
      dVar9 = dVar8;
      if (pHVar2[lVar7 + -1].cost_diff <= pHVar2->cost_diff &&
          pHVar2->cost_diff != pHVar2[lVar7 + -1].cost_diff) {
        dVar8 = pHVar2->cost_combo;
        iVar1 = pHVar2->idx1;
        iVar5 = pHVar2->idx2;
        dVar3 = pHVar2->cost_diff;
        pHVar2->cost_combo = pHVar2[lVar7 + -1].cost_combo;
        iVar6 = pHVar2[lVar7 + -1].idx2;
        dVar4 = pHVar2[lVar7 + -1].cost_diff;
        pHVar2->idx1 = pHVar2[lVar7 + -1].idx1;
        pHVar2->idx2 = iVar6;
        pHVar2->cost_diff = dVar4;
        pHVar2[lVar7 + -1].cost_combo = dVar8;
        pHVar2[lVar7 + -1].idx1 = iVar1;
        pHVar2[lVar7 + -1].idx2 = iVar5;
        pHVar2[lVar7 + -1].cost_diff = dVar3;
      }
    }
  }
  return dVar9;
}

Assistant:

static double HistoQueuePush(HistoQueue* const histo_queue,
                             VP8LHistogram** const histograms, int idx1,
                             int idx2, double threshold) {
  const VP8LHistogram* h1;
  const VP8LHistogram* h2;
  HistogramPair pair;

  // Stop here if the queue is full.
  if (histo_queue->size == histo_queue->max_size) return 0.;
  assert(threshold <= 0.);
  if (idx1 > idx2) {
    const int tmp = idx2;
    idx2 = idx1;
    idx1 = tmp;
  }
  pair.idx1 = idx1;
  pair.idx2 = idx2;
  h1 = histograms[idx1];
  h2 = histograms[idx2];

  HistoQueueUpdatePair(h1, h2, threshold, &pair);

  // Do not even consider the pair if it does not improve the entropy.
  if (pair.cost_diff >= threshold) return 0.;

  histo_queue->queue[histo_queue->size++] = pair;
  HistoQueueUpdateHead(histo_queue, &histo_queue->queue[histo_queue->size - 1]);

  return pair.cost_diff;
}